

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_abs_value_hessian2(REF_GRID ref_grid,REF_DBL *hessian)

{
  REF_NODE ref_node;
  uint uVar1;
  long lVar2;
  REF_DBL *m;
  REF_DBL diag_system [6];
  double local_68;
  double local_60;
  
  ref_node = ref_grid->node;
  if (0 < ref_node->max) {
    lVar2 = 0;
    m = hessian;
    do {
      if ((-1 < ref_node->global[lVar2]) && (ref_node->ref_mpi->id == ref_node->part[lVar2])) {
        uVar1 = ref_matrix_diag_m2(m,&local_68);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x658,"ref_recon_abs_value_hessian2",(ulong)uVar1,"decomp");
          return uVar1;
        }
        if (local_68 <= -local_68) {
          local_68 = -local_68;
        }
        if (local_60 <= -local_60) {
          local_60 = -local_60;
        }
        uVar1 = ref_matrix_form_m2(&local_68,m);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x65b,"ref_recon_abs_value_hessian2",(ulong)uVar1,"re-form");
          return uVar1;
        }
      }
      lVar2 = lVar2 + 1;
      m = m + 3;
    } while (lVar2 < ref_node->max);
  }
  uVar1 = ref_node_ghost_dbl(ref_node,hessian,3);
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x65f,
           "ref_recon_abs_value_hessian2",(ulong)uVar1,"update ghosts");
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_abs_value_hessian2(REF_GRID ref_grid,
                                                       REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[6];
  REF_INT node;

  /* positive eigenvalues to make positive definite */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_diag_m2(&(hessian[3 * node]), diag_system), "decomp");
      ref_matrix_eig2(diag_system, 0) = ABS(ref_matrix_eig2(diag_system, 0));
      ref_matrix_eig2(diag_system, 1) = ABS(ref_matrix_eig2(diag_system, 1));
      RSS(ref_matrix_form_m2(diag_system, &(hessian[3 * node])), "re-form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  return REF_SUCCESS;
}